

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void LinkedList_RemoveEntry(LinkedList **start,void *toRemove,FAudioMutex lock,FAudioFreeFunc pFree)

{
  code *pcVar1;
  int iVar2;
  code *in_RCX;
  long in_RSI;
  long *in_RDI;
  SDL_AssertState sdl_assert_state;
  LinkedList *prev;
  LinkedList *latest;
  long *local_30;
  long *local_28;
  
  local_30 = (long *)*in_RDI;
  FAudio_PlatformLockMutex((FAudioMutex)0x12e2c9);
  for (local_28 = local_30; local_28 != (long *)0x0; local_28 = (long *)local_28[1]) {
    if (*local_28 == in_RSI) {
      if (local_28 == local_30) {
        *in_RDI = local_28[1];
      }
      else {
        local_30[1] = local_28[1];
      }
      (*in_RCX)(local_28);
      FAudio_PlatformUnlockMutex((FAudioMutex)0x12e327);
      return;
    }
    local_30 = local_28;
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x12e34d);
  do {
    iVar2 = SDL_ReportAssertion(&LinkedList_RemoveEntry::sdl_assert_data,"LinkedList_RemoveEntry",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio_internal.c"
                                ,0xed);
  } while (iVar2 == 0);
  if (iVar2 != 1) {
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void LinkedList_RemoveEntry(
	LinkedList **start,
	void* toRemove,
	FAudioMutex lock,
	FAudioFreeFunc pFree
) {
	LinkedList *latest, *prev;
	latest = *start;
	prev = latest;
	FAudio_PlatformLockMutex(lock);
	while (latest != NULL)
	{
		if (latest->entry == toRemove)
		{
			if (latest == prev) /* First in list */
			{
				*start = latest->next;
			}
			else
			{
				prev->next = latest->next;
			}
			pFree(latest);
			FAudio_PlatformUnlockMutex(lock);
			return;
		}
		prev = latest;
		latest = latest->next;
	}
	FAudio_PlatformUnlockMutex(lock);
	FAudio_assert(0 && "LinkedList element not found!");
}